

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

int bitstream_w_write(bitstream_w *stream,uint64_t src,int32_t bits)

{
  byte *pbVar1;
  void *pvVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (0 < bits) {
    if (0x38 < (uint)bits) {
      return -1;
    }
    uVar6 = stream->bit_offset;
    uVar7 = (ulong)((int)uVar6 + bits + 7U >> 3);
    if (stream->length < uVar7) {
      return -1;
    }
    pvVar2 = stream->ptr;
    uVar8 = uVar6 >> 3 & 0x1fffffff;
    stream->bit_offset = uVar6 + (uint)bits;
    if (uVar7 != uVar8) {
      uVar5 = bits + (int)uVar6 & 7;
      bVar4 = (byte)uVar5;
      bVar3 = 8 - bVar4;
      if (uVar5 == 0) {
        bVar3 = bVar4;
      }
      uVar6 = (~(-1L << ((byte)bits & 0x3f)) & src) << (bVar3 & 0x3f);
      do {
        pbVar1 = (byte *)((long)pvVar2 + (uVar7 - 1));
        *pbVar1 = *pbVar1 | (byte)uVar6;
        uVar6 = uVar6 >> 8;
        uVar7 = uVar7 - 1;
      } while (uVar8 != uVar7);
    }
  }
  return 0;
}

Assistant:

int
bitstream_w_write(struct bitstream_w *stream, uint64_t src, int32_t bits) {
  uint32_t bit_start, bit_end;
  size_t offset, size;
  uint8_t *buffer;

  if (bits <= 0) {
    return 0;
  }

  if (bits > 56) {
    return -1;
  }

  buffer = stream->ptr;

  /* copy range */
  bit_start = stream->bit_offset;
  bit_end = bit_start + bits;

  /* calculate offset */
  offset = bit_start / 8;
  size = (bit_end + 7) / 8 - offset;

  /* check range */
  if (offset + size > stream->length) {
    return -1;
  }

  /* advance pointer */
  stream->bit_offset += bits;

  /* mask input */
  src &= ((1ull << bits) - 1ull);

  /* shift source value */
  bit_end = bit_end & 7;
  if (bit_end != 0) {
    src <<= (8 - bit_end);
  }

  /* write data to buffer */
  while (size > 0) {
    size--;

    buffer[offset + size] |= (src & 0xFF);
    src >>= 8;
  }

  return 0;
}